

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.h
# Opt level: O1

result_type __thiscall MeCab::Dictionary::exactMatchSearch(Dictionary *this,char *key)

{
  unit_t *puVar1;
  size_t sVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  result_type rVar6;
  
  sVar2 = strlen(key);
  puVar1 = (this->da_).array_;
  uVar3 = puVar1->base;
  if (sVar2 != 0) {
    sVar4 = 0;
    do {
      uVar5 = (byte)key[sVar4] + uVar3 + 1;
      if (uVar3 != puVar1[uVar5].check) {
        sVar4 = 0;
        uVar5 = 0xffffffff;
        goto LAB_00127d0e;
      }
      sVar4 = sVar4 + 1;
      uVar3 = puVar1[uVar5].base;
    } while (sVar2 != sVar4);
  }
  sVar4 = 0;
  uVar5 = 0xffffffff;
  if (uVar3 == puVar1[uVar3].check && puVar1[uVar3].base < 0) {
    sVar4 = sVar2;
    uVar5 = ~puVar1[uVar3].base;
  }
LAB_00127d0e:
  rVar6._4_4_ = 0;
  rVar6.value = uVar5;
  rVar6.length = sVar4;
  return rVar6;
}

Assistant:

result_type exactMatchSearch(const char* key) const {
    result_type n;
    da_.exactMatchSearch(key, n);
    return n;
  }